

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printDefun(JSPrinter *this,Ref node)

{
  undefined8 *puVar1;
  char *pcVar2;
  size_t sVar3;
  size_t i;
  ulong uVar4;
  Value *local_40;
  Ref args;
  Ref node_local;
  
  args = node;
  emit(this,"function ");
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&args);
  pcVar2 = Value::getCString((Value *)*puVar1);
  emit(this,pcVar2);
  emit(this,'(');
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&args);
  local_40 = (Value *)*puVar1;
  for (uVar4 = 0; sVar3 = Value::size(local_40), uVar4 < sVar3; uVar4 = uVar4 + 1) {
    if (uVar4 != 0) {
      if (this->pretty == true) {
        emit(this,", ");
      }
      else {
        emit(this,',');
      }
    }
    puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_40);
    pcVar2 = Value::getCString((Value *)*puVar1);
    emit(this,pcVar2);
  }
  emit(this,')');
  space(this);
  sVar3 = Value::size(args.inst);
  if (sVar3 != 3) {
    puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&args);
    sVar3 = Value::size((Value *)*puVar1);
    if (sVar3 != 0) {
      emit(this,'{');
      this->indent = this->indent + 1;
      newline(this);
      puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&args);
      printStats(this,(Value *)*puVar1);
      this->indent = this->indent + -1;
      newline(this);
      emit(this,'}');
      newline(this);
      return;
    }
  }
  emit(this,"{}");
  return;
}

Assistant:

void printDefun(Ref node) {
    emit("function ");
    emit(node[1]->getCString());
    emit('(');
    Ref args = node[2];
    for (size_t i = 0; i < args->size(); i++) {
      if (i > 0) {
        (pretty ? emit(", ") : emit(','));
      }
      emit(args[i]->getCString());
    }
    emit(')');
    space();
    if (node->size() == 3 || node[3]->size() == 0) {
      emit("{}");
      return;
    }
    emit('{');
    indent++;
    newline();
    printStats(node[3]);
    indent--;
    newline();
    emit('}');
    newline();
  }